

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O3

void generalMultTest1(int dim,int dl)

{
  CSC *pCVar1;
  iterator iVar2;
  Matrix *pMVar3;
  CSR *pCVar4;
  long lVar5;
  Matrix *pMVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  diagonal *this;
  Matrix *pMVar10;
  double *pdVar11;
  int iVar12;
  double durationSym1;
  vector<double,_std::allocator<double>_> tm4;
  vector<double,_std::allocator<double>_> tm3;
  vector<double,_std::allocator<double>_> tm2;
  vector<double,_std::allocator<double>_> tm1;
  double local_140;
  Matrix *local_138;
  Matrix *local_130;
  CSC *local_128;
  CSR *local_120;
  double *local_118;
  iterator iStack_110;
  double *local_108;
  double *local_f8;
  iterator iStack_f0;
  double *local_e8;
  double *local_d8;
  iterator iStack_d0;
  double *local_c8;
  double *local_b8;
  iterator iStack_b0;
  double *local_a8;
  Matrix *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = (double *)0x0;
  iStack_b0._M_current = (double *)0x0;
  local_a8 = (double *)0x0;
  local_c8 = (double *)0x0;
  local_d8 = (double *)0x0;
  iStack_d0._M_current = (double *)0x0;
  local_e8 = (double *)0x0;
  local_f8 = (double *)0x0;
  iStack_f0._M_current = (double *)0x0;
  local_108 = (double *)0x0;
  local_118 = (double *)0x0;
  iStack_110._M_current = (double *)0x0;
  pMVar3 = (Matrix *)operator_new(0x30);
  local_130 = pMVar3;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  Matrix::Matrix(pMVar3,dim,dim,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"diagonal","");
  Matrix::Random(pMVar3,dl,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  Matrix::LowerTriangular(pMVar3);
  pCVar4 = (CSR *)operator_new(0x30);
  CSR::CSR(pCVar4,pMVar3);
  pMVar3 = (Matrix *)operator_new(0x30);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"vector:","");
  Matrix::Matrix(pMVar3,dim,1,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  Matrix::Random(pMVar3);
  local_138 = (Matrix *)CONCAT44(local_138._4_4_,dim);
  local_98 = (Matrix *)CONCAT44(local_98._4_4_,dl);
  iVar12 = 5;
  local_120 = pCVar4;
  do {
    lVar5 = std::chrono::_V2::system_clock::now();
    pMVar6 = CSR::csrMult(local_120,pMVar3);
    lVar7 = std::chrono::_V2::system_clock::now();
    local_140 = (double)(lVar7 - lVar5) / 1000000000.0;
    if (iStack_b0._M_current == local_a8) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_b8,iStack_b0,&local_140);
    }
    else {
      *iStack_b0._M_current = local_140;
      iStack_b0._M_current = iStack_b0._M_current + 1;
    }
    if (pMVar6 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar6);
    }
    operator_delete(pMVar6,0x30);
    iVar2._M_current = iStack_b0._M_current;
    pdVar11 = local_b8;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_b8 != iStack_b0._M_current) {
    uVar8 = (long)iStack_b0._M_current - (long)local_b8 >> 3;
    lVar5 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b8,iStack_b0._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar11,iVar2._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"multiply(CSR)",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  iVar2._M_current = iStack_b0._M_current;
  for (pdVar11 = local_b8; pdVar11 != iVar2._M_current; pdVar11 = pdVar11 + 1) {
    poVar9 = std::ostream::_M_insert<double>(*pdVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ,",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  iVar12 = CSR::turntoCSC(local_120);
  local_128 = (CSC *)operator_new(0x30);
  CSC::CSC(local_128,(int)local_138,(int)local_138,iVar12,local_120->ptr,local_120->idx,
           local_120->val);
  iVar12 = 5;
  do {
    lVar5 = std::chrono::_V2::system_clock::now();
    pMVar6 = CSC::cscMult(local_128,pMVar3);
    lVar7 = std::chrono::_V2::system_clock::now();
    local_140 = (double)(lVar7 - lVar5) / 1000000000.0;
    if (iStack_d0._M_current == local_c8) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_d8,iStack_d0,&local_140);
    }
    else {
      *iStack_d0._M_current = local_140;
      iStack_d0._M_current = iStack_d0._M_current + 1;
    }
    if (pMVar6 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar6);
    }
    operator_delete(pMVar6,0x30);
    iVar2._M_current = iStack_d0._M_current;
    pdVar11 = local_d8;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_d8 != iStack_d0._M_current) {
    uVar8 = (long)iStack_d0._M_current - (long)local_d8 >> 3;
    lVar5 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_d8,iStack_d0._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar11,iVar2._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"multiply(CSC)",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  iVar2._M_current = iStack_d0._M_current;
  for (pdVar11 = local_d8; pdVar11 != iVar2._M_current; pdVar11 = pdVar11 + 1) {
    poVar9 = std::ostream::_M_insert<double>(*pdVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ,",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  this = (diagonal *)operator_new(0x18);
  pMVar6 = local_130;
  diagonal::diagonal(this,(int)local_138,(int)local_138,(int)local_98);
  pMVar6 = diagonal::diaStore(this,pMVar6,1);
  diagonal::offsetCompute(this,1);
  iVar12 = 5;
  do {
    lVar5 = std::chrono::_V2::system_clock::now();
    pMVar10 = diagonal::diaMult(this,pMVar6,pMVar3);
    lVar7 = std::chrono::_V2::system_clock::now();
    local_140 = (double)(lVar7 - lVar5) / 1000000000.0;
    if (iStack_f0._M_current == local_e8) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_f8,iStack_f0,&local_140);
    }
    else {
      *iStack_f0._M_current = local_140;
      iStack_f0._M_current = iStack_f0._M_current + 1;
    }
    if (pMVar10 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar10);
    }
    operator_delete(pMVar10,0x30);
    iVar2._M_current = iStack_f0._M_current;
    pdVar11 = local_f8;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_f8 != iStack_f0._M_current) {
    uVar8 = (long)iStack_f0._M_current - (long)local_f8 >> 3;
    lVar5 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_f8,iStack_f0._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar11,iVar2._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"multiply(dia1)",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  iVar2._M_current = iStack_f0._M_current;
  local_138 = pMVar6;
  for (pdVar11 = local_f8; pdVar11 != iVar2._M_current; pdVar11 = pdVar11 + 1) {
    poVar9 = std::ostream::_M_insert<double>(*pdVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ,",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pMVar6 = diagonal::diaStore2(this,local_130,1);
  iVar12 = 5;
  do {
    lVar5 = std::chrono::_V2::system_clock::now();
    pMVar10 = diagonal::diaMult2(this,pMVar6,pMVar3);
    lVar7 = std::chrono::_V2::system_clock::now();
    local_140 = (double)(lVar7 - lVar5) / 1000000000.0;
    if (iStack_110._M_current == local_108) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_118,iStack_110,&local_140);
    }
    else {
      *iStack_110._M_current = local_140;
      iStack_110._M_current = iStack_110._M_current + 1;
    }
    if (pMVar10 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar10);
    }
    operator_delete(pMVar10,0x30);
    iVar2._M_current = iStack_110._M_current;
    pdVar11 = local_118;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_118 != iStack_110._M_current) {
    uVar8 = (long)iStack_110._M_current - (long)local_118 >> 3;
    lVar5 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_118,iStack_110._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar11,iVar2._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"multiply(dia2)",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  iVar2._M_current = iStack_110._M_current;
  local_98 = pMVar6;
  for (pdVar11 = local_118; pdVar11 != iVar2._M_current; pdVar11 = pdVar11 + 1) {
    poVar9 = std::ostream::_M_insert<double>(*pdVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ,",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pMVar6 = local_130;
  Matrix::~Matrix(local_130);
  operator_delete(pMVar6,0x30);
  pCVar4 = local_120;
  CSR::~CSR(local_120);
  operator_delete(pCVar4,0x30);
  Matrix::~Matrix(pMVar3);
  operator_delete(pMVar3,0x30);
  pCVar1 = local_128;
  CSC::~CSC(local_128);
  operator_delete(pCVar1,0x30);
  diagonal::~diagonal(this);
  operator_delete(this,0x18);
  pMVar3 = local_138;
  if (local_138 != (Matrix *)0x0) {
    Matrix::~Matrix(local_138);
  }
  operator_delete(pMVar3,0x30);
  pMVar3 = local_98;
  if (local_98 != (Matrix *)0x0) {
    Matrix::~Matrix(local_98);
  }
  operator_delete(pMVar3,0x30);
  if (local_118 != (double *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  if (local_f8 != (double *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_d8 != (double *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  if (local_b8 != (double *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return;
}

Assistant:

void generalMultTest1(int dim, int dl)
{
    // 5for rows - 2 for dia
    vector<double> tm1;
    vector<double> tm2;
    vector<double> tm3;
    vector<double> tm4;
    Matrix *dia1 = new Matrix(dim,dim," ");
    dia1->Random(dl,"diagonal");
    dia1->LowerTriangular();
    // dia1->print();

    //save matrix in csr format
    CSR *cr1 = new CSR(dia1);
    // cr1->triplet();
    Matrix *v1 = new Matrix(dim,1,"vector:");
     v1->Random();


    //execution time-start
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result1 = cr1->csrMult(v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end-start;
        double durationSym1=elapsed_seconds.count();
         //cout<<"execution time(CSR):"<< durationSym1<<"\n";
        //execution time-end
        //result1->print();
        tm1.push_back(durationSym1);
        delete result1;
    }
    sort(tm1.begin(), tm1.end());
    cout << "multiply(CSR)"<<",";
    for (auto x : tm1)
        cout << x << " ,";
    cout<<"\n";

    //save matrix in csc format
      int nnz = cr1->turntoCSC();
      CSC *cc1 = new CSC(dim,dim, nnz, cr1->ptr, cr1->idx, cr1->val);
    // cc1->Triplet();

    //execution time-start
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result2 = cc1->cscMult(v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end-start;
        double durationSym2=elapsed_seconds.count();
        // cout<<"execution time(CSC):"<< durationSym2 <<"\n";
        //execution time-end
        // result2->print();
        tm2.push_back(durationSym2);
        delete result2;
    }
    sort(tm2.begin(), tm2.end());
    cout << "multiply(CSC)"<<",";
    for (auto x : tm2)
        cout << x << " ,";
    cout<<"\n";

    //save matrix in diagonal format
    diagonal *d1 = new diagonal(dim,dim,dl);
    Matrix *d2 = d1->diaStore(dia1,1);
    d1->offsetCompute(1);
    //  d2->print();
    //execution time-start
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result3 = d1->diaMult(d2,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym3 = elapsed_seconds.count();
        //  cout << "execution time (dia):" << durationSym3 << "\n";
        //execution time-end
        //  result3->print();
        tm3.push_back(durationSym3);
        delete result3;
    }
    sort(tm3.begin(), tm3.end());
    cout << "multiply(dia1)"<<",";
    for (auto x : tm3)
        cout << x << " ,";
    cout<<"\n";

// diagonal2
    Matrix *m2 = d1->diaStore2(dia1, 1);
    // m2->print();
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result4 = d1->diaMult2(m2,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym4 = elapsed_seconds.count();
       //  cout << "execution time (dia2):" << durationSym4 << "\n";
        //result4->print();
        tm4.push_back(durationSym4);
        delete result4;
    }
    sort(tm4.begin(), tm4.end());
    cout << "multiply(dia2)"<<",";
    for (auto x : tm4)
        cout << x << " ,";
    cout<<"\n";

    //testing the result
    /*bool  t1 = result1->isequal(result2);
    bool  t2 = result2->isequal(result3);
    bool  t3 = result2->isequal(result4);
    bool  t4 = result3->isequal(result4);
    bool  t5 = result1->isequal(result4);
    cout << "the result of multiply of csc & csr & dia & dia2 is:"<< t1 <<","<< t2 << "," << t3<<"," << t4<<"," << t5<<"\n";

    cout<<  "\n";*/

    delete dia1;
    delete cr1;
    delete v1;
    delete cc1;
    delete d1;
    delete d2;
    delete m2;

}